

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

sizes_t * __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
::get_all_sizes(sizes_t *__return_storage_ptr__,
               flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
               *this)

{
  pointer_type pcVar1;
  ulong uVar2;
  buffer_type *pbVar3;
  size_with_padding<1UL> sVar4;
  sizes_t *s;
  flat_forward_list_iterator_t<const_pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>
  local_30;
  range_t local_28;
  flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
  *local_10;
  flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
  *this_local;
  
  local_10 = this;
  flat_forward_list_sizes<1UL>::flat_forward_list_sizes(__return_storage_ptr__);
  pbVar3 = buff(this);
  pcVar1 = pbVar3->end;
  pbVar3 = buff(this);
  __return_storage_ptr__->total_capacity = (long)pcVar1 - (long)pbVar3->begin;
  pbVar3 = buff(this);
  if (pbVar3->last != (pointer_type)0x0) {
    pbVar3 = buff(this);
    flat_forward_list_iterator_t<const_pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>
    ::flat_forward_list_iterator_t(&local_30,pbVar3->last);
    range_unsafe(&local_28,this,&local_30);
    (__return_storage_ptr__->last_element).super_range.buffer_begin =
         local_28.super_range.buffer_begin;
    (__return_storage_ptr__->last_element).super_range.data_end = local_28.super_range.data_end;
    (__return_storage_ptr__->last_element).super_range.buffer_end = local_28.super_range.buffer_end;
  }
  uVar2 = __return_storage_ptr__->total_capacity;
  sVar4 = flat_forward_list_sizes<1UL>::used_capacity(__return_storage_ptr__);
  if (uVar2 < sVar4.size) {
    std::terminate();
  }
  return __return_storage_ptr__;
}

Assistant:

sizes_t get_all_sizes() const noexcept {
        sizes_t s;

        s.total_capacity = buff().end - buff().begin;

        if (nullptr != buff().last) {
            s.last_element = range_unsafe(const_iterator{ buff().last });
        }
        FFL_CODDING_ERROR_IF(s.total_capacity < s.used_capacity().size);

        return s;
    }